

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool perfetto::internal::TrackEventInternal::Initialize
               (TrackEventCategoryRegistry *registry,
               _func_bool_DataSourceDescriptor_ptr *register_data_source)

{
  size_t *psVar1;
  Category *pCVar2;
  char *pcVar3;
  _func_bool_DataSourceDescriptor_ptr *p_Var4;
  bool bVar5;
  int iVar6;
  long lVar7;
  Message *this;
  size_t sVar8;
  Category *pCVar9;
  long lVar10;
  ulong uVar11;
  HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> ted;
  DataSourceDescriptor dsd;
  long *local_268;
  size_t local_260;
  long local_258 [2];
  long *local_248;
  size_t local_240;
  long local_238 [2];
  long *local_228;
  size_t local_220;
  long local_218 [2];
  long *local_208;
  size_t local_200;
  long local_1f8 [2];
  _func_bool_DataSourceDescriptor_ptr *local_1e8;
  TrackEventCategoryRegistry *local_1e0;
  long local_1d8;
  string local_1d0;
  HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> local_1b0;
  undefined1 local_f0 [88];
  string local_98 [96];
  byte local_38;
  
  if (_ZN8perfetto8internal12_GLOBAL__N_113g_main_threadE_0 == 0) {
    lVar7 = syscall(0xba);
    LOCK();
    _ZN8perfetto8internal12_GLOBAL__N_113g_main_threadE_0 = (int)lVar7;
    UNLOCK();
  }
  protos::gen::DataSourceDescriptor::DataSourceDescriptor((DataSourceDescriptor *)local_f0);
  psVar1 = &local_1b0.shb_.maximum_slice_size_;
  local_1b0.shb_.super_Delegate._vptr_Delegate = (_func_int **)psVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"track_event","");
  ::std::__cxx11::string::_M_assign((string *)(local_f0 + 8));
  local_38 = local_38 | 2;
  if (local_1b0.shb_.super_Delegate._vptr_Delegate != (_func_int **)psVar1) {
    operator_delete(local_1b0.shb_.super_Delegate._vptr_Delegate,
                    local_1b0.shb_.maximum_slice_size_ + 1);
  }
  local_1e8 = register_data_source;
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::HeapBuffered
            (&local_1b0,0x1000,0x1000);
  if (registry->category_count_ != 0) {
    lVar7 = 0x10;
    uVar11 = 0;
    local_1e0 = registry;
    do {
      pCVar2 = registry->categories_;
      if (pCVar2[uVar11].name_sizes_._M_elems[1] == '\0') {
        this = protozero::Message::BeginNestedMessageInternal((Message *)&local_1b0.msg_,1);
        pCVar9 = pCVar2 + uVar11;
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,pCVar9->name,(allocator<char> *)&local_1d0);
        protozero::Message::AppendBytes(this,1,local_208,local_200);
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        pcVar3 = pCVar9->description;
        if (pcVar3 != (char *)0x0) {
          local_228 = local_218;
          sVar8 = strlen(pcVar3);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,pcVar3,pcVar3 + sVar8);
          protozero::Message::AppendBytes(this,2,local_228,local_220);
          if (local_228 != local_218) {
            operator_delete(local_228,local_218[0] + 1);
          }
        }
        lVar10 = 0;
        local_1d8 = lVar7;
        do {
          pcVar3 = *(char **)((long)(pCVar2->tags)._M_elems + lVar10 + lVar7 + -0x10);
          if (pcVar3 != (char *)0x0) {
            local_248 = local_238;
            sVar8 = strlen(pcVar3);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_248,pcVar3,pcVar3 + sVar8);
            protozero::Message::AppendBytes(this,3,local_248,local_240);
            if (local_248 != local_238) {
              operator_delete(local_248,local_238[0] + 1);
            }
          }
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x20);
        iVar6 = strncmp(pCVar9->name,"disabled-by-default-",0x14);
        lVar7 = local_1d8;
        registry = local_1e0;
        if (iVar6 == 0) {
          local_268 = local_258;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,&(anonymous_namespace)::kSlowTag,0x32d069);
          protozero::Message::AppendBytes(this,3,local_268,local_260);
          if (local_268 != local_258) {
            operator_delete(local_268,local_258[0] + 1);
          }
        }
      }
      uVar11 = uVar11 + 1;
      lVar7 = lVar7 + 0x38;
    } while (uVar11 < registry->category_count_);
  }
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::
  SerializeAsString_abi_cxx11_(&local_1d0,&local_1b0);
  ::std::__cxx11::string::_M_assign(local_98);
  p_Var4 = local_1e8;
  local_38 = local_38 | 0x40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  bVar5 = (*p_Var4)((DataSourceDescriptor *)local_f0);
  protozero::MessageArena::~MessageArena(&local_1b0.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_1b0.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_1b0.shb_);
  protos::gen::DataSourceDescriptor::~DataSourceDescriptor((DataSourceDescriptor *)local_f0);
  return bVar5;
}

Assistant:

bool TrackEventInternal::Initialize(
    const TrackEventCategoryRegistry& registry,
    bool (*register_data_source)(const DataSourceDescriptor&)) {
  if (!g_main_thread)
    g_main_thread = perfetto::base::GetThreadId();

  DataSourceDescriptor dsd;
  dsd.set_name("track_event");

  protozero::HeapBuffered<protos::pbzero::TrackEventDescriptor> ted;
  for (size_t i = 0; i < registry.category_count(); i++) {
    auto category = registry.GetCategory(i);
    // Don't register group categories.
    if (category->IsGroup())
      continue;
    auto cat = ted->add_available_categories();
    cat->set_name(category->name);
    if (category->description)
      cat->set_description(category->description);
    for (const auto& tag : category->tags) {
      if (tag)
        cat->add_tags(tag);
    }
    // Disabled-by-default categories get a "slow" tag.
    if (!strncmp(category->name, kLegacySlowPrefix, strlen(kLegacySlowPrefix)))
      cat->add_tags(kSlowTag);
  }
  dsd.set_track_event_descriptor_raw(ted.SerializeAsString());

  return register_data_source(dsd);
}